

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmrsrv(mcmcxdef *cctx,ushort siz,mcmon clinum,mclhd loadhd)

{
  errcxdef *ctx_00;
  anon_union_8_2_048b8c28_for_mcmoloc in_RCX;
  ushort in_DX;
  ushort in_SI;
  undefined8 *in_RDI;
  mcmodef *o;
  mcmon glb;
  mcmcx1def *ctx;
  char *in_stack_ffffffffffffffc8;
  mcmon *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  mcmon in_stack_ffffffffffffffde;
  mcmcxdef *cctx_00;
  
  cctx_00 = (mcmcxdef *)*in_RDI;
  ctx_00 = (errcxdef *)
           mcmoal((mcmcx1def *)CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),
                  in_stack_ffffffffffffffd0);
  if (ctx_00 == (errcxdef *)0x0) {
    errsigf((errcxdef *)0x0,in_stack_ffffffffffffffc8,0);
  }
  *(anon_union_8_2_048b8c28_for_mcmoloc *)&ctx_00->errcxlog = in_RCX;
  *(ushort *)((long)&ctx_00->errcxlgc + 4) = 0;
  *(ushort *)&ctx_00->errcxofs = in_SI;
  mcmcliexp(cctx_00,in_stack_ffffffffffffffde);
  if (*(short *)(in_RDI[(long)((int)(uint)in_DX >> 8) + 6] + (long)(int)(in_DX & 0xff) * 2) != -1) {
    errsigf(ctx_00,in_stack_ffffffffffffffc8,0);
  }
  *(mcmon *)(in_RDI[(long)((int)(uint)in_DX >> 8) + 6] + (long)(int)(in_DX & 0xff) * 2) =
       in_stack_ffffffffffffffde;
  return;
}

Assistant:

void mcmrsrv(mcmcxdef *cctx, ushort siz, mcmon clinum, mclhd loadhd)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    mcmodef   *o;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    o = mcmoal(ctx, &glb);                       /* get a new object header */
    if (!o) errsig(ctx->mcmcxerr, ERR_NOHDR);     /* can't get a new header */
    
    o->mcmoldh = loadhd;
    o->mcmoflg = 0;
    o->mcmosiz = siz;
    
    mcmcliexp(cctx, clinum);
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);
    
    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
}